

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  size_t sVar2;
  ulong uVar3;
  char *pcVar4;
  char *mainFileName;
  size_t newTargetLen;
  char *local_70;
  char *local_50;
  uint local_44;
  long lStack_40;
  int ch;
  size_t targetFileNameLen;
  char *dependFileName;
  char *pcStack_28;
  uint32_t maxDepth;
  char *sourceDateEpoch;
  time_t now;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  now = (time_t)argv;
  argv_local._0_4_ = argc;
  sourceDateEpoch = (char *)time((time_t *)0x0);
  pcStack_28 = getenv("SOURCE_DATE_EPOCH");
  if (pcStack_28 != (char *)0x0) {
    sourceDateEpoch = (char *)strtoul(pcStack_28,(char **)0x0,0);
  }
  sym_Init((time_t)sourceDateEpoch);
  opt_B("01");
  opt_G("0123");
  opt_P('\0');
  opt_Q('\x10');
  haltNop = false;
  warnOnHaltNop = true;
  optimizeLoads = false;
  warnOnLdOpt = true;
  verbose = false;
  warnings = true;
  sym_SetExportAll(false);
  dependFileName._4_4_ = 0x40;
  targetFileNameLen = 0;
  lStack_40 = 0;
  while (local_44 = musl_getopt_long_only
                              ((int)argv_local,(char **)now,optstring,longopts,(int *)0x0),
        local_44 != 0xffffffff) {
    switch(local_44) {
    case 0:
      if (depType - 0x47U < 0xd || depType == 0x54) {
        switch((long)&switchD_00114683::switchdataD_001279a0 +
               (long)(int)(&switchD_00114683::switchdataD_001279a0)[depType - 0x47U]) {
        case 0x114685:
          generatedMissingIncludes = true;
          break;
        case 0x114691:
          generatePhonyDeps = true;
          break;
        case 0x11469d:
          newTargetLen = (size_t)musl_optarg;
          if (depType == 0x51) {
            newTargetLen = (size_t)make_escape(musl_optarg);
          }
          sVar2 = strlen((char *)newTargetLen);
          sVar2 = sVar2 + 1;
          targetFileName = (char *)realloc(targetFileName,lStack_40 + sVar2 + 1);
          if (targetFileName == (char *)0x0) {
            err("Cannot append new file to target file list");
          }
          memcpy(targetFileName + lStack_40,(void *)newTargetLen,sVar2);
          if (depType == 0x51) {
            free((void *)newTargetLen);
          }
          lStack_40 = sVar2 + lStack_40;
          targetFileName[lStack_40 + -1] = ' ';
        }
      }
      break;
    default:
      fprintf(_stderr,"FATAL: unknown option \'%c\'\n",(ulong)local_44);
      printUsage();
      exit(1);
    case 0x44:
      pcVar4 = strchr(musl_optarg,0x3d);
      if (pcVar4 == (char *)0x0) {
        sym_AddString(musl_optarg,"1");
      }
      else {
        *pcVar4 = '\0';
        sym_AddString(musl_optarg,pcVar4 + 1);
      }
      break;
    case 0x45:
      sym_SetExportAll(true);
      break;
    case 0x48:
      if ((warnOnHaltNop & 1U) == 0) {
        errx("`-H` and `-h` don\'t make sense together");
      }
      warning(WARNING_OBSOLETE,"Automatic `nop` after `halt` is deprecated\n");
      haltNop = true;
      warnOnHaltNop = false;
      break;
    case 0x4c:
      if ((optimizeLoads & 1U) != 0) {
        errx("`-L` and `-l` don\'t make sense together");
      }
      break;
    case 0x4d:
      if (dependfile != (FILE *)0x0) {
        warnx("Overriding dependfile %s",targetFileNameLen);
      }
      iVar1 = strcmp("-",musl_optarg);
      if (iVar1 == 0) {
        dependfile = _stdout;
        targetFileNameLen = (size_t)anon_var_dwarf_d03b;
      }
      else {
        dependfile = (FILE *)fopen(musl_optarg,"w");
        targetFileNameLen = (size_t)musl_optarg;
      }
      if (dependfile == (FILE *)0x0) {
        err("Could not open dependfile %s",targetFileNameLen);
      }
      break;
    case 0x50:
      fstk_SetPreIncludeFile(musl_optarg);
      break;
    case 0x51:
      local_70 = musl_optarg;
      if (*musl_optarg == '.') {
        local_70 = musl_optarg + 1;
      }
      uVar3 = strtoul(local_70,&local_50,0);
      if ((*musl_optarg == '\0') || (*local_50 != '\0')) {
        errx("Invalid argument for option \'Q\'");
      }
      if ((uVar3 == 0) || (0x1f < uVar3)) {
        errx("Argument for option \'Q\' must be between 1 and 31");
      }
      opt_Q((uint8_t)uVar3);
      break;
    case 0x56:
      pcVar4 = get_package_version_string();
      printf("rgbasm %s\n",pcVar4);
      exit(0);
    case 0x57:
      processWarningFlag(musl_optarg);
      break;
    case 0x62:
      sVar2 = strlen(musl_optarg);
      if (sVar2 != 2) {
        errx("Must specify exactly 2 characters for option \'b\'");
      }
      opt_B(musl_optarg);
      break;
    case 0x67:
      sVar2 = strlen(musl_optarg);
      if (sVar2 != 4) {
        errx("Must specify exactly 4 characters for option \'g\'");
      }
      opt_G(musl_optarg);
      break;
    case 0x68:
      if ((haltNop & 1U) != 0) {
        errx("`-H` and `-h` don\'t make sense together");
      }
      break;
    case 0x69:
      warning(WARNING_OBSOLETE,"`-i` is deprecated; use `-I`\n");
    case 0x49:
      fstk_AddIncludePath(musl_optarg);
      break;
    case 0x6c:
      if ((warnOnLdOpt & 1U) == 0) {
        errx("`-L` and `-l` don\'t make sense together");
      }
      warning(WARNING_OBSOLETE,"Automatic `ld` to `ldh` optimization is deprecated\n");
      optimizeLoads = true;
      warnOnLdOpt = false;
      break;
    case 0x6f:
      out_SetFileName(musl_optarg);
      break;
    case 0x70:
      uVar3 = strtoul(musl_optarg,&local_50,0);
      if ((*musl_optarg == '\0') || (*local_50 != '\0')) {
        errx("Invalid argument for option \'p\'");
      }
      if (0xff < uVar3) {
        errx("Argument for option \'p\' must be between 0 and 0xFF");
      }
      opt_P((uint8_t)uVar3);
      break;
    case 0x72:
      uVar3 = strtoul(musl_optarg,&local_50,0);
      dependFileName._4_4_ = (uint)uVar3;
      if ((*musl_optarg == '\0') || (*local_50 != '\0')) {
        errx("Invalid argument for option \'r\'");
      }
      break;
    case 0x76:
      verbose = true;
      break;
    case 0x77:
      warnings = false;
    }
  }
  if (targetFileName == (char *)0x0) {
    targetFileName = objectName;
  }
  else {
    targetFileName[lStack_40 + -1] = '\0';
  }
  if ((int)argv_local == musl_optind) {
    fputs("FATAL: Please specify an input file (pass `-` to read from standard input)\n",_stderr);
    printUsage();
    exit(1);
  }
  if ((int)argv_local != musl_optind + 1) {
    fputs("FATAL: More than one input file specified\n",_stderr);
    printUsage();
    exit(1);
  }
  pcVar4 = *(char **)(now + (long)musl_optind * 8);
  if ((verbose & 1U) != 0) {
    printf("Assembling %s\n",pcVar4);
  }
  if (dependfile != (FILE *)0x0) {
    if (targetFileName == (char *)0x0) {
      errx(
          "Dependency files can only be created if a target file is specified with either -o, -MQ or -MT"
          );
    }
    fprintf((FILE *)dependfile,"%s: %s\n",targetFileName,pcVar4);
  }
  charmap_New("main",(char *)0x0);
  lexer_Init();
  fstk_Init(pcVar4,(ulong)dependFileName._4_4_);
  iVar1 = yyparse();
  if ((iVar1 != 0) && (nbErrors == 0)) {
    nbErrors = 1;
  }
  if (dependfile != (FILE *)0x0) {
    fclose((FILE *)dependfile);
  }
  sect_CheckUnionClosed();
  if (nbErrors != 0) {
    pcVar4 = "s";
    if (nbErrors == 1) {
      pcVar4 = "";
    }
    errx("Assembly aborted (%u error%s)!",(ulong)nbErrors,pcVar4);
  }
  if (((failedOnMissingInclude & 1U) == 0) && (objectName != (char *)0x0)) {
    out_WriteObject();
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
	time_t now = time(NULL);
	char const *sourceDateEpoch = getenv("SOURCE_DATE_EPOCH");

	// Support SOURCE_DATE_EPOCH for reproducible builds
	// https://reproducible-builds.org/docs/source-date-epoch/
	if (sourceDateEpoch)
		now = (time_t)strtoul(sourceDateEpoch, NULL, 0);

	// Perform some init for below
	sym_Init(now);

	// Set defaults

	opt_B("01");
	opt_G("0123");
	opt_P(0);
	opt_Q(16);
	haltNop = false;
	warnOnHaltNop = true;
	optimizeLoads = false;
	warnOnLdOpt = true;
	verbose = false;
	warnings = true;
	sym_SetExportAll(false);
	uint32_t maxDepth = DEFAULT_MAX_DEPTH;
	char const *dependFileName = NULL;
	size_t targetFileNameLen = 0;

	for (int ch; (ch = musl_getopt_long_only(argc, argv, optstring, longopts, NULL)) != -1;) {
		switch (ch) {
			char *endptr;

		case 'b':
			if (strlen(musl_optarg) == 2)
				opt_B(musl_optarg);
			else
				errx("Must specify exactly 2 characters for option 'b'");
			break;

			char *equals;
		case 'D':
			equals = strchr(musl_optarg, '=');
			if (equals) {
				*equals = '\0';
				sym_AddString(musl_optarg, equals + 1);
			} else {
				sym_AddString(musl_optarg, "1");
			}
			break;

		case 'E':
			sym_SetExportAll(true);
			break;

		case 'g':
			if (strlen(musl_optarg) == 4)
				opt_G(musl_optarg);
			else
				errx("Must specify exactly 4 characters for option 'g'");
			break;

		case 'H':
			if (warnOnHaltNop)
				warning(WARNING_OBSOLETE,
					"Automatic `nop` after `halt` is deprecated\n");
			else
				errx("`-H` and `-h` don't make sense together");
			haltNop = true;
			warnOnHaltNop = false;
			break;
		case 'h':
			if (haltNop)
				errx("`-H` and `-h` don't make sense together");
			break;

		// `-i` was the only short option for `--include` until `-I` was
		// introduced to better match the `-I dir` option of gcc and clang.
		case 'i':
			warning(WARNING_OBSOLETE, "`-i` is deprecated; use `-I`\n");
			// fallthrough
		case 'I':
			fstk_AddIncludePath(musl_optarg);
			break;

		case 'L':
			if (optimizeLoads)
				errx("`-L` and `-l` don't make sense together");
			break;
		case 'l':
			if (warnOnLdOpt)
				warning(WARNING_OBSOLETE,
					"Automatic `ld` to `ldh` optimization is deprecated\n");
			else
				errx("`-L` and `-l` don't make sense together");
			optimizeLoads = true;
			warnOnLdOpt = false;
			break;

		case 'M':
			if (dependfile)
				warnx("Overriding dependfile %s", dependFileName);
			if (!strcmp("-", musl_optarg)) {
				dependfile = stdout;
				dependFileName = "<stdout>";
			} else {
				dependfile = fopen(musl_optarg, "w");
				dependFileName = musl_optarg;
			}
			if (dependfile == NULL)
				err("Could not open dependfile %s", dependFileName);
			break;

		case 'o':
			out_SetFileName(musl_optarg);
			break;

		case 'P':
			fstk_SetPreIncludeFile(musl_optarg);
			break;

			unsigned long padByte;
		case 'p':
			padByte = strtoul(musl_optarg, &endptr, 0);

			if (musl_optarg[0] == '\0' || *endptr != '\0')
				errx("Invalid argument for option 'p'");

			if (padByte > 0xFF)
				errx("Argument for option 'p' must be between 0 and 0xFF");

			opt_P(padByte);
			break;

			unsigned long precision;
			const char *precisionArg;
		case 'Q':
			precisionArg = musl_optarg;
			if (precisionArg[0] == '.')
				precisionArg++;
			precision = strtoul(precisionArg, &endptr, 0);

			if (musl_optarg[0] == '\0' || *endptr != '\0')
				errx("Invalid argument for option 'Q'");

			if (precision < 1 || precision > 31)
				errx("Argument for option 'Q' must be between 1 and 31");

			opt_Q(precision);
			break;

		case 'r':
			maxDepth = strtoul(musl_optarg, &endptr, 0);

			if (musl_optarg[0] == '\0' || *endptr != '\0')
				errx("Invalid argument for option 'r'");
			break;

		case 'V':
			printf("rgbasm %s\n", get_package_version_string());
			exit(0);

		case 'v':
			verbose = true;
			break;

		case 'W':
			processWarningFlag(musl_optarg);
			break;

		case 'w':
			warnings = false;
			break;

		// Long-only options
		case 0:
			switch (depType) {
			case 'G':
				generatedMissingIncludes = true;
				break;

			case 'P':
				generatePhonyDeps = true;
				break;

				char *newTarget;
			case 'Q':
			case 'T':
				newTarget = musl_optarg;
				if (depType == 'Q')
					newTarget = make_escape(newTarget);
				size_t newTargetLen = strlen(newTarget) + 1; // Plus the space

				targetFileName = (char *)realloc(targetFileName,
							 targetFileNameLen + newTargetLen + 1);
				if (targetFileName == NULL)
					err("Cannot append new file to target file list");
				memcpy(&targetFileName[targetFileNameLen], newTarget, newTargetLen);
				if (depType == 'Q')
					free(newTarget);
				targetFileNameLen += newTargetLen;
				targetFileName[targetFileNameLen - 1] = ' ';
				break;
			}
			break;

		// Unrecognized options
		default:
			fprintf(stderr, "FATAL: unknown option '%c'\n", ch);
			printUsage();
			exit(1);
		}
	}

	if (targetFileName == NULL)
		targetFileName = objectName;
	else
		targetFileName[targetFileNameLen - 1] = '\0'; // Overwrite the last space

	if (argc == musl_optind) {
		fputs("FATAL: Please specify an input file (pass `-` to read from standard input)\n", stderr);
		printUsage();
		exit(1);
	} else if (argc != musl_optind + 1) {
		fputs("FATAL: More than one input file specified\n", stderr);
		printUsage();
		exit(1);
	}

	char const *mainFileName = argv[musl_optind];

	if (verbose)
		printf("Assembling %s\n", mainFileName);

	if (dependfile) {
		if (!targetFileName)
			errx("Dependency files can only be created if a target file is specified with either -o, -MQ or -MT");

		fprintf(dependfile, "%s: %s\n", targetFileName, mainFileName);
	}

	charmap_New(DEFAULT_CHARMAP_NAME, NULL);

	// Init lexer and file stack, providing file info
	lexer_Init();
	fstk_Init(mainFileName, maxDepth);

	// Perform parse (yyparse is auto-generated from `parser.y`)
	if (yyparse() != 0 && nbErrors == 0)
		nbErrors = 1;

	if (dependfile)
		fclose(dependfile);

	sect_CheckUnionClosed();

	if (nbErrors != 0)
		errx("Assembly aborted (%u error%s)!", nbErrors,
			nbErrors == 1 ? "" : "s");

	// If parse aborted due to missing an include, and `-MG` was given, exit normally
	if (failedOnMissingInclude)
		return 0;

	// If no path specified, don't write file
	if (objectName != NULL)
		out_WriteObject();
	return 0;
}